

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_filter.hpp
# Opt level: O3

bool __thiscall
jsoncons::
json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
::visit_key(json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
            *this,string_view_type *name,ser_context *context,error_code *ec)

{
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *pjVar1;
  type tVar2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> target;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_28;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = L'\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  tVar2 = unicode_traits::convert<char,std::__cxx11::wstring>
                    (name->_M_str,name->_M_len,&local_50,strict);
  if (tVar2.ec != success) {
    std::error_code::operator=(ec,tVar2.ec);
  }
  pjVar1 = (this->
           super_json_visitor_adaptor_base<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>_>
           ).destination1_;
  local_30 = local_50._M_string_length;
  local_28 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
              *)local_50._M_dataplus._M_p;
  (*(pjVar1->super_basic_json_visitor<wchar_t>)._vptr_basic_json_visitor[9])
            (pjVar1,&local_30,context,ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT44(local_50.field_2._M_local_buf[1],local_50.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name,
        const ser_context& context,
        std::error_code& ec) override
    {
        std::basic_string<typename To::char_type> target;
        auto result = unicode_traits::convert(name.data(), name.size(), target, unicode_traits::conv_flags::strict);
        if (result.ec != unicode_traits::conv_errc())
        {
            ec = result.ec;
        }
        return destination().key(target, context, ec);
    }